

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

void mp_clamp(mp_int *a)

{
  bool bVar1;
  mp_int *a_local;
  
  while( true ) {
    bVar1 = false;
    if (0 < a->used) {
      bVar1 = a->dp[a->used + -1] == 0;
    }
    if (!bVar1) break;
    a->used = a->used + -1;
  }
  if (a->used == 0) {
    a->sign = 0;
  }
  return;
}

Assistant:

void mp_clamp (mp_int * a)
{
  /* decrease used while the most significant digit is
   * zero.
   */
  while (a->used > 0 && a->dp[a->used - 1] == 0) {
    --(a->used);
  }

  /* reset the sign flag if used == 0 */
  if (a->used == 0) {
    a->sign = MP_ZPOS;
  }
}